

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Module.cpp
# Opt level: O2

void __thiscall remote::Module::CacheSymbolData(Module *this)

{
  short sVar1;
  int *__ptr;
  Module *this_00;
  ostream *poVar2;
  char *buffer;
  string local_40;
  
  GetPath_abi_cxx11_(&local_40,this);
  std::__cxx11::string::~string((string *)&local_40);
  if (local_40._M_string_length == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"No path!");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    GetPath_abi_cxx11_(&local_40,this);
    __ptr = (int *)elf::Open(local_40._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_40);
    if (__ptr != (int *)0x0) {
      if (*__ptr == 0x464c457f) {
        sVar1 = *(short *)((long)__ptr + 0x12);
        buffer = "ELF OK!";
        this_00 = (Module *)std::operator<<((ostream *)&std::cout,"ELF OK!");
        std::endl<char,std::char_traits<char>>((ostream *)this_00);
        if (sVar1 == 1) {
          CacheSymbolData32(this_00,buffer);
        }
        else if ((sVar1 == 0x3e) || (sVar1 == 0x32)) {
          CacheSymbolData64(this_00,__ptr);
        }
        else {
          poVar2 = std::operator<<((ostream *)&std::cout,"Arch problems??? Fgt.");
          std::endl<char,std::char_traits<char>>(poVar2);
        }
        elf::Close(__ptr);
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout,"ELF header magic failed");
        std::endl<char,std::char_traits<char>>(poVar2);
        free(__ptr);
      }
    }
  }
  return;
}

Assistant:

void remote::Module::CacheSymbolData() {
    if(GetPath().length() == 0) {
        std::cout << "No path!" << std::endl;
        return;
    }

    void* elf_data = elf::Open(GetPath().c_str());

    if(elf_data == NULL)
        return;

    // We now have elf data!
    // We can check the 'basic' variables like magic and machine without proper 32/64 alignment
    // We re-cast later when we have determined the proper arch
    Elf64_Ehdr ehdr = *(Elf64_Ehdr*) elf_data;

    if(memcmp(ehdr.e_ident, ELFMAG, SELFMAG) != 0) {
        std::cout << "ELF header magic failed" << std::endl;
        free(elf_data);
        return;
    }
    std::cout << "ELF OK!" << std::endl;

    if(ehdr.e_machine == EM_IA_64 || ehdr.e_machine == EM_X86_64) {
        CacheSymbolData64(elf_data);
    } else if(ehdr.e_machine == EM_M32) {
        CacheSymbolData32(elf_data);
    } else {
        std::cout << "Arch problems??? Fgt." << std::endl;
    }

    elf::Close(elf_data);
}